

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O3

void duckdb_zstd::ZSTD_DCtx_trace_end
               (ZSTD_DCtx *dctx,U64 uncompressedSize,U64 compressedSize,uint streaming)

{
  uint uVar1;
  ZSTD_TraceCtx ZVar2;
  ZSTD_Trace local_58;
  
  ZVar2 = dctx->traceCtx;
  if (ZVar2 != 0) {
    local_58.params = (ZSTD_CCtx_params_s *)0x0;
    local_58.cctx = (ZSTD_CCtx_s *)0x0;
    local_58.uncompressedSize = 0;
    local_58.compressedSize = 0;
    local_58.dictionaryID = 0;
    local_58.dictionaryIsCold = 0;
    local_58.dictionarySize = 0;
    local_58.version = 0x290a;
    local_58.streaming = streaming;
    if (dctx->ddict != (ZSTD_DDict *)0x0) {
      uVar1 = ZSTD_getDictID_fromDDict(dctx->ddict);
      local_58.dictionaryID = uVar1;
      local_58.dictionarySize = ZSTD_DDict_dictSize(dctx->ddict);
      local_58.dictionaryIsCold = dctx->ddictIsCold;
      ZVar2 = dctx->traceCtx;
    }
    local_58.uncompressedSize = uncompressedSize;
    local_58.compressedSize = compressedSize;
    local_58.dctx = dctx;
    duckdb_zstd::ZSTD_trace_decompress_end(ZVar2,&local_58);
  }
  return;
}

Assistant:

static void ZSTD_DCtx_trace_end(ZSTD_DCtx const* dctx, U64 uncompressedSize, U64 compressedSize, unsigned streaming)
{
#if ZSTD_TRACE
    if (dctx->traceCtx && ZSTD_trace_decompress_end != NULL) {
        ZSTD_Trace trace;
        ZSTD_memset(&trace, 0, sizeof(trace));
        trace.version = ZSTD_VERSION_NUMBER;
        trace.streaming = streaming;
        if (dctx->ddict) {
            trace.dictionaryID = ZSTD_getDictID_fromDDict(dctx->ddict);
            trace.dictionarySize = ZSTD_DDict_dictSize(dctx->ddict);
            trace.dictionaryIsCold = dctx->ddictIsCold;
        }
        trace.uncompressedSize = (size_t)uncompressedSize;
        trace.compressedSize = (size_t)compressedSize;
        trace.dctx = dctx;
        ZSTD_trace_decompress_end(dctx->traceCtx, &trace);
    }
#else
    (void)dctx;
    (void)uncompressedSize;
    (void)compressedSize;
    (void)streaming;
#endif
}